

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-birth.c
# Opt level: O2

wchar_t textui_do_birth(void)

{
  uint my;
  _Bool _Var1;
  birth_stage current;
  keycode_t kVar2;
  uint32_t uVar3;
  ui_event_type uVar4;
  int iVar5;
  void *pvVar6;
  textblock *tb;
  size_t sVar7;
  char *pcVar8;
  char *pcVar9;
  command_conflict *pcVar10;
  menu_conflict *pmVar11;
  uint uVar12;
  uint uVar13;
  level_map_conflict **pplVar14;
  level_map_conflict *plVar15;
  ulong uVar16;
  wchar_t i;
  int iVar17;
  ulong uVar18;
  cmd_code cVar19;
  wchar_t wVar20;
  long lVar21;
  birth_stage bVar22;
  int iVar23;
  birth_stage bVar24;
  ulong n;
  int iVar25;
  bool bVar26;
  region orig_area;
  ui_event uVar27;
  keypress kVar28;
  birth_stage local_25c;
  ulong local_250;
  size_t *line_lengths;
  size_t *line_starts;
  char local_235 [5];
  undefined8 local_230;
  uint8_t local_228;
  char *local_220;
  size_t local_218 [30];
  char old_history [240];
  
  cmdq_push(CMD_BIRTH_INIT);
  cmdq_execute(CTX_BIRTH);
  local_25c = BIRTH_RESET;
  bVar26 = false;
  bVar24 = BIRTH_RESET;
  bVar22 = BIRTH_BACK;
LAB_001c5daf:
  current = bVar24;
  if (bVar26) {
    return L'\0';
  }
  switch(current) {
  case BIRTH_RESET:
    cmdq_push(CMD_BIRTH_RESET);
    bVar24 = BIRTH_MAP_CHOICE - (uint)quickstart_allowed;
    local_25c = BIRTH_RESET;
    goto LAB_001c6bd0;
  case BIRTH_QUICKSTART:
    display_player(L'\0');
    prt("New character based on previous one:",L'\0',L'\0');
    prt("[\'Y\': use as is; \'N\': redo; \'C\': change name/history; \'=\': set birth options]",
        Term->hgt + L'\xffffffff',Term->wid / 2 + L'\xffffffda');
    do {
      while( true ) {
        while( true ) {
          kVar28 = inkey();
          uVar16 = kVar28._0_8_ & 0xffffffdf00000000;
          if (uVar16 == 0x4e00000000) {
            cVar19 = CMD_BIRTH_RESET;
            bVar24 = BIRTH_MAP_CHOICE;
            goto LAB_001c6674;
          }
          if (kVar28.code != 0x18) break;
          quit((char *)0x0);
        }
        if ((uVar16 == 0x4300000000) && (arg_force_name == false)) {
          bVar24 = BIRTH_NAME_CHOICE;
          goto LAB_001c6b0c;
        }
        if (kVar28.code != 0x3d) break;
        do_cmd_options_birth();
      }
    } while (uVar16 != 0x5900000000);
    cVar19 = CMD_ACCEPT_CHARACTER;
    bVar24 = BIRTH_COMPLETE;
LAB_001c6674:
    cmdq_push(cVar19);
LAB_001c6b0c:
    clear_from(L'\x17');
    bVar26 = bVar24 == BIRTH_COMPLETE;
    break;
  case BIRTH_MAP_CHOICE:
    Term_clear();
    text_out_hook = text_out_to_screen;
    text_out_indent = L'\x05';
    Term_gotoxy(L'\x05',L'\x01');
    text_out_e(
              "    *    \n  #{light yellow}#{/} {light yellow}#{/}#  \n #{light green}#{/}{light yellow}#{/} {light yellow}#{/}{light green}#{/}# \n/{light yellow}##{/}{deep light blue}/{/}{yellow}@{/}{deep light blue}\\{/}{light yellow}##{/}\\\n*  {yellow}@{/}{orange}@{/}{yellow}@{/}  *  Welcome to First Age Angband!\n\\{light yellow}##{/}{deep light blue}\\{/}{yellow}@{/}{deep light blue}/{/}{light yellow}##{/}/\n #{light green}#{/}{light yellow}#{/} {light yellow}#{/}{light green}#{/}# \n  #{light yellow}#{/} {light yellow}#{/}#  \n    *    \n\nThere are different ways of structuring the world\nof FAangband; \'{light green}?{/}\' gives more details."
              );
    text_out_indent = L'\0';
    pmVar11 = menu_new(MN_SKIN_SCROLL,&map_menu_iter);
    old_history[0] = '\x05';
    old_history[1] = '\0';
    old_history[2] = '\0';
    old_history[3] = '\0';
    old_history[4] = '\x0e';
    old_history[5] = '\0';
    old_history[6] = '\0';
    old_history[7] = '\0';
    old_history[8] = 'F';
    old_history[9] = '\0';
    old_history[10] = '\0';
    old_history[0xb] = '\0';
    old_history[0xc] = -99;
    old_history[0xd] = -1;
    old_history[0xe] = -1;
    old_history[0xf] = -1;
    current_map_index = L'\xffffffff';
    num_maps = L'\x01';
    sVar7 = 0x10;
    pplVar14 = &maps;
    while (plVar15 = *pplVar14, plVar15 != (level_map_conflict *)0x0) {
      if (plVar15 == world) {
        current_map_index = num_maps + L'\xffffffff';
      }
      sVar7 = sVar7 + 0x10;
      num_maps = num_maps + L'\x01';
      pplVar14 = &plVar15->next;
    }
    pvVar6 = mem_zalloc(sVar7);
    wVar20 = num_maps;
    uVar16 = 0;
    if (L'\0' < num_maps) {
      uVar16 = (ulong)(uint)num_maps;
    }
    plVar15 = maps;
    for (lVar21 = 0; uVar16 * 0x10 != lVar21; lVar21 = lVar21 + 0x10) {
      if (plVar15 == (level_map_conflict *)0x0) {
        *(char **)((long)pvVar6 + lVar21) = "Quit";
        *(char **)((long)pvVar6 + lVar21 + 8) = "Quit FAangband.";
        plVar15 = (level_map_conflict *)0x0;
      }
      else {
        pcVar9 = plVar15->help;
        *(undefined8 *)((long)pvVar6 + lVar21) = plVar15->name;
        ((undefined8 *)((long)pvVar6 + lVar21))[1] = pcVar9;
        plVar15 = plVar15->next;
      }
    }
    menu_setpriv(pmVar11,wVar20,pvVar6);
    pmVar11->cmd_keys = "?";
    pmVar11->flags = 8;
    pmVar11->selections = "abcdefghijklmnopqrstuvwxyz";
    pmVar11->browse_hook = map_menu_browser;
    old_history._12_4_ = num_maps + L'\x01';
    menu_layout(pmVar11,(region_conflict *)old_history);
    screen_save();
    region_erase_bordered((region *)&pmVar11->active);
    bVar24 = BIRTH_RESET;
    menu_select(pmVar11,0,true);
    screen_load();
    if (current_map_index != L'\xffffffff') {
      if (current_map_index == num_maps + L'\xffffffff') {
        bVar24 = BIRTH_RESET;
        quit((char *)0x0);
      }
      else {
        cmdq_push(CMD_CHOOSE_MAP);
        pcVar10 = cmdq_peek();
        cmd_set_arg_choice(pcVar10,"choice",pmVar11->cursor);
        bVar24 = BIRTH_RACE_CHOICE;
      }
    }
    pvVar6 = menu_priv(pmVar11);
    mem_free(pvVar6);
    mem_free(pmVar11);
    goto LAB_001c6bd0;
  case BIRTH_RACE_CHOICE:
  case BIRTH_CLASS_CHOICE:
  case BIRTH_ROLLER_CHOICE:
    Term_clear();
    Term_clear();
    text_out_hook = text_out_to_screen;
    text_out_indent = L'\x02';
    Term_gotoxy(L'\x02',L'\x01');
    text_out_e(
              "{light blue}Please select your character traits from the menus below:{/}\n\nUse the {light green}movement keys{/} to scroll the menu, {light green}Enter{/} to select the current menu item, \'{light green}*{/}\' for a random menu item, \'{light green}@{/}\' to finish the character with random selections, \'{light green}ESC{/}\' to step back through the birth process, \'{light green}={/}\' for the birth options, \'{light green}?{/}\' for help, or \'{light green}Ctrl-X{/}\' to quit."
              );
    text_out_indent = L'\0';
    pmVar11 = &race_menu;
    cVar19 = CMD_CHOOSE_RACE;
    if (3 < (uint)current) {
      menu_refresh(&race_menu,false);
      pmVar11 = &class_menu;
      cVar19 = CMD_CHOOSE_CLASS;
      if (current != BIRTH_CLASS_CHOICE) {
        menu_refresh(&class_menu,false);
        pmVar11 = &roller_menu;
      }
    }
    pvVar6 = menu_priv(pmVar11);
    for (wVar20 = L'\a'; wVar20 != L'\t'; wVar20 = wVar20 + L'\x01') {
      Term_erase(L'\0',wVar20,L'ÿ');
    }
    Term_putstr(L'\x02',L'\a',L'\xffffffff',L'\v',*(char **)((long)pvVar6 + 8));
    pmVar11->cmd_keys = "?=*@\x18";
LAB_001c5eb9:
    do {
      bVar22 = BIRTH_RESET;
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                if (bVar22 != BIRTH_RESET) {
                  bVar24 = current + BIRTH_BACK;
                  if (bVar22 != BIRTH_BACK) {
                    bVar24 = bVar22;
                  }
                  if (bVar24 == BIRTH_QUICKSTART) {
                    bVar24 = BIRTH_RESET;
                  }
                  goto LAB_001c608c;
                }
                *(birth_stage *)((long)pvVar6 + 0x14) = current;
                uVar27 = menu_select(pmVar11,1,false);
                uVar4 = uVar27.type;
                if (uVar4 == EVT_KBRD) break;
                bVar22 = BIRTH_BACK;
                if (uVar4 != EVT_ESCAPE) {
                  if (uVar4 == EVT_SWITCH) {
                    bVar22 = *(birth_stage *)((long)pvVar6 + 0x14);
                  }
                  else {
                    if (uVar4 != EVT_SELECT) goto LAB_001c5eb9;
                    if (current == BIRTH_ROLLER_CHOICE) {
                      if (pmVar11->cursor == 0) {
                        point_based_start();
                        cmdq_push(CMD_RESET_STATS);
                        pcVar10 = cmdq_peek();
                        cmd_set_arg_choice(pcVar10,"choice",L'\x01');
                        bVar22 = BIRTH_POINTBASED;
                      }
                      else {
                        cmdq_push(CMD_ROLL_STATS);
                        bVar22 = BIRTH_ROLLER;
                      }
                    }
                    else {
                      cmdq_push(cVar19);
                      pcVar10 = cmdq_peek();
                      cmd_set_arg_choice(pcVar10,"choice",pmVar11->cursor);
                      bVar22 = current + BIRTH_QUICKSTART;
                    }
                  }
                }
              }
              if ((ulong)uVar27.mouse >> 0x20 != 0x18) break;
              quit((char *)0x0);
              bVar22 = BIRTH_RESET;
            }
            kVar2 = uVar27.key.code;
            if (kVar2 != 0x40) break;
            finish_with_random_choices(current);
            bVar22 = BIRTH_FINAL_CONFIRM;
          }
          if (kVar2 != 0x3d) break;
          do_cmd_options_birth();
          bVar22 = current;
        }
        if (kVar2 == 0x3f) break;
        bVar22 = BIRTH_RESET;
        if ((kVar2 == 0x2a) && (bVar22 = BIRTH_RESET, *(char *)((long)pvVar6 + 0x10) == '\x01')) {
          uVar3 = Rand_div(pmVar11->count);
          pmVar11->cursor = uVar3;
          cmdq_push(cVar19);
          pcVar10 = cmdq_peek();
          cmd_set_arg_choice(pcVar10,"choice",pmVar11->cursor);
          menu_refresh(pmVar11,false);
          bVar22 = current + BIRTH_QUICKSTART;
        }
      }
      do_cmd_help();
    } while( true );
  case BIRTH_POINTBASED:
    if (BIRTH_POINTBASED < bVar22) {
      point_based_start();
      cmdq_push(CMD_REFRESH_STATS);
      cmdq_execute(CTX_BIRTH);
    }
    Term_gotoxy(L'N',point_based_command_stat + L'\x02');
LAB_001c6450:
    uVar27 = inkey_ex();
    uVar16 = uVar27._0_8_;
    uVar4 = uVar27.type;
    if (1 < uVar4 - EVT_KBRD) goto code_r0x001c6463;
    uVar12 = uVar27.key.code;
    if (uVar4 == EVT_KBRD) {
      if (uVar16 >> 0x20 == 0x18) goto switchD_001c6ed4_caseD_6;
      if (uVar12 != 0xe000) {
        if ((uVar16 & 0xffffffdf00000000) == 0x5200000000) goto switchD_001c6ed4_caseD_4;
        if (uVar12 == 0x2b) goto switchD_001c6f46_caseD_6;
        if (uVar12 == 0x2d) goto switchD_001c6f46_caseD_4;
        bVar24 = BIRTH_NAME_CHOICE;
        if (uVar12 == 0x9c) goto switchD_001c6ed4_caseD_5;
        kVar28._8_4_ = uVar27._8_4_ & 0xff;
        kVar28.type = (int)uVar16;
        kVar28.code = (int)(uVar16 >> 0x20);
        wVar20 = target_dir(kVar28);
        bVar26 = false;
        local_25c = BIRTH_POINTBASED;
        bVar24 = BIRTH_POINTBASED;
        switch(wVar20) {
        case L'\x02':
          uVar12 = point_based_command_stat + L'\x01';
          break;
        case L'\x03':
        case L'\x05':
        case L'\a':
          goto switchD_001c6f46_caseD_3;
        case L'\x04':
          goto switchD_001c6f46_caseD_4;
        case L'\x06':
          goto switchD_001c6f46_caseD_6;
        case L'\b':
          uVar12 = point_based_command_stat + L'\x04';
          break;
        default:
          goto switchD_001c6f46_default;
        }
        point_based_command_stat = uVar12 % 5;
        goto switchD_001c6f46_default;
      }
      goto switchD_001c6ed4_caseD_3;
    }
    if ((uVar16 & 0xff000000000000) == 0x2000000000000) goto switchD_001c6ed4_caseD_3;
    my = uVar12 >> 8 & 0xff;
    if (((uint)(my + L'\xfffffffe') < 5) && (my != point_based_command_stat + L'\x02')) {
      local_25c = BIRTH_POINTBASED;
      point_based_command_stat = my + L'\xfffffffe';
      bVar24 = BIRTH_POINTBASED;
      goto LAB_001c608c;
    }
    pcVar9 = string_make("abcdefghijklmnopqrstuvwxyz");
    pmVar11 = menu_dynamic_new();
    pmVar11->selections = pcVar9;
    uVar16 = (ulong)(uint)point_based_command_stat;
    uVar13 = point_based_command_stat + L'\x02';
    if (my == uVar13) {
      if ((*(byte *)(buysell + uVar16) & 1) != 0) {
        menu_dynamic_add_label(pmVar11,"Sell",'s',2,pcVar9);
        uVar16 = (ulong)(uint)point_based_command_stat;
        uVar13 = point_based_command_stat + L'\x02';
        goto LAB_001c6df1;
      }
LAB_001c6df6:
      if ((*(byte *)(buysell + uVar16) & 2) != 0) {
        menu_dynamic_add_label(pmVar11,"Buy",'b',1,pcVar9);
      }
    }
    else {
LAB_001c6df1:
      if (my == uVar13) goto LAB_001c6df6;
    }
    menu_dynamic_add_label(pmVar11,"Accept",'a',5,pcVar9);
    menu_dynamic_add_label(pmVar11,"Reset",'r',4,pcVar9);
    menu_dynamic_add_label(pmVar11,"Quit",'q',6,pcVar9);
    screen_save();
    menu_dynamic_calc_location(pmVar11,uVar12 & 0xff,my);
    region_erase_bordered((region *)&pmVar11->boundary);
    iVar23 = menu_dynamic_select(pmVar11);
    menu_dynamic_free(pmVar11);
    string_free(pcVar9);
    screen_load();
    bVar24 = BIRTH_NAME_CHOICE;
    switch(iVar23) {
    case 1:
switchD_001c6f46_caseD_6:
      cVar19 = CMD_BUY_STAT;
      goto LAB_001c6f9d;
    case 2:
switchD_001c6f46_caseD_4:
      cVar19 = CMD_SELL_STAT;
LAB_001c6f9d:
      cmdq_push(cVar19);
      pcVar10 = cmdq_peek();
      cmd_set_arg_choice(pcVar10,"choice",point_based_command_stat);
      break;
    case 3:
      goto switchD_001c6ed4_caseD_3;
    case 4:
switchD_001c6ed4_caseD_4:
      cmdq_push(CMD_RESET_STATS);
      pcVar10 = cmdq_peek();
      cmd_set_arg_choice(pcVar10,"choice",L'\0');
      break;
    case 5:
      goto switchD_001c6ed4_caseD_5;
    case 6:
switchD_001c6ed4_caseD_6:
      quit((char *)0x0);
      break;
    default:
      local_25c = BIRTH_POINTBASED;
      bVar24 = BIRTH_POINTBASED;
LAB_001c608c:
      bVar26 = false;
      goto switchD_001c6f46_caseD_3;
    }
switchD_001c6f46_default:
    bVar26 = false;
    local_25c = BIRTH_POINTBASED;
    bVar24 = local_25c;
    break;
  case BIRTH_ROLLER:
    old_history[0x40] = '\0';
    old_history[0x41] = '\0';
    old_history[0x42] = '\0';
    old_history[0x43] = '\0';
    old_history[0x44] = '\0';
    old_history[0x45] = '\0';
    old_history[0x46] = '\0';
    old_history[0x47] = '\0';
    old_history[0x48] = '\0';
    old_history[0x49] = '\0';
    old_history[0x4a] = '\0';
    old_history[0x4b] = '\0';
    old_history[0x4c] = '\0';
    old_history[0x4d] = '\0';
    old_history[0x4e] = '\0';
    old_history[0x4f] = '\0';
    old_history[0x30] = '\0';
    old_history[0x31] = '\0';
    old_history[0x32] = '\0';
    old_history[0x33] = '\0';
    old_history[0x34] = '\0';
    old_history[0x35] = '\0';
    old_history[0x36] = '\0';
    old_history[0x37] = '\0';
    old_history[0x38] = '\0';
    old_history[0x39] = '\0';
    old_history[0x3a] = '\0';
    old_history[0x3b] = '\0';
    old_history[0x3c] = '\0';
    old_history[0x3d] = '\0';
    old_history[0x3e] = '\0';
    old_history[0x3f] = '\0';
    old_history[0x20] = '\0';
    old_history[0x21] = '\0';
    old_history[0x22] = '\0';
    old_history[0x23] = '\0';
    old_history[0x24] = '\0';
    old_history[0x25] = '\0';
    old_history[0x26] = '\0';
    old_history[0x27] = '\0';
    old_history[0x28] = '\0';
    old_history[0x29] = '\0';
    old_history[0x2a] = '\0';
    old_history[0x2b] = '\0';
    old_history[0x2c] = '\0';
    old_history[0x2d] = '\0';
    old_history[0x2e] = '\0';
    old_history[0x2f] = '\0';
    old_history[0x10] = '\0';
    old_history[0x11] = '\0';
    old_history[0x12] = '\0';
    old_history[0x13] = '\0';
    old_history[0x14] = '\0';
    old_history[0x15] = '\0';
    old_history[0x16] = '\0';
    old_history[0x17] = '\0';
    old_history[0x18] = '\0';
    old_history[0x19] = '\0';
    old_history[0x1a] = '\0';
    old_history[0x1b] = '\0';
    old_history[0x1c] = '\0';
    old_history[0x1d] = '\0';
    old_history[0x1e] = '\0';
    old_history[0x1f] = '\0';
    old_history[0] = '\0';
    old_history[1] = '\0';
    old_history[2] = '\0';
    old_history[3] = '\0';
    old_history[4] = '\0';
    old_history[5] = '\0';
    old_history[6] = '\0';
    old_history[7] = '\0';
    old_history[8] = '\0';
    old_history[9] = '\0';
    old_history[10] = '\0';
    old_history[0xb] = '\0';
    old_history[0xc] = '\0';
    old_history[0xd] = '\0';
    old_history[0xe] = '\0';
    old_history[0xf] = '\0';
    local_218[0] = 0;
    display_player(L'\0');
    if (bVar22 < BIRTH_ROLLER) {
      roller_command_prev_roll = 0;
    }
    strnfcat(old_history,0x50,local_218,"[\'r\' to reroll");
    if (roller_command_prev_roll == 1) {
      strnfcat(old_history,0x50,local_218,", \'p\' for previous roll");
    }
    strnfcat(old_history,0x50,local_218," or \'Enter\' to accept]");
    prt(old_history,Term->hgt + L'\xffffffff',Term->wid / 2 - (int)(local_218[0] >> 1));
    do {
      uVar27 = inkey_ex();
      uVar16 = uVar27._0_8_;
      uVar4 = uVar27.type;
      if (uVar4 - EVT_KBRD < 2) goto LAB_001c6201;
      if (uVar4 == EVT_ESCAPE) goto switchD_001c6d84_caseD_1;
    } while (uVar4 != EVT_BUTTON);
    uVar16 = (uVar16 & 0xffffffff00000000) + 1;
LAB_001c6201:
    uVar12 = (uint)(uVar16 >> 0x20);
    if ((int)uVar16 != 2) {
      bVar24 = BIRTH_ROLLER;
      if ((int)uVar16 != 1) goto switchD_001c6d84_default;
      if ((uVar16 >> 0x20 == 0x20) || (uVar12 == 0x72)) goto switchD_001c6d84_caseD_2;
      if (uVar12 == 0x9c) goto switchD_001c6d84_caseD_4;
      if (uVar12 != 0xe000) {
        if ((uVar12 == 0x70) && ((roller_command_prev_roll & 1) != 0))
        goto switchD_001c6d84_caseD_3;
        if (uVar12 == 0x18) goto switchD_001c6d84_caseD_5;
        if (uVar12 == 0x3f) goto switchD_001c6d84_caseD_6;
        bell();
        goto LAB_001c6f6d;
      }
switchD_001c6d84_caseD_1:
      bVar26 = false;
      local_25c = BIRTH_ROLLER;
      bVar24 = BIRTH_ROLLER_CHOICE;
      break;
    }
    if ((uVar16 & 0xff000000000000) == 0x2000000000000) goto switchD_001c6d84_caseD_1;
    pcVar9 = string_make("abcdefghijklmnopqrstuvwxyz");
    pmVar11 = menu_dynamic_new();
    pmVar11->selections = pcVar9;
    menu_dynamic_add_label(pmVar11,"Reroll",'r',2,pcVar9);
    if (roller_command_prev_roll == 1) {
      menu_dynamic_add_label(pmVar11,"Retrieve previous",'p',3,pcVar9);
    }
    menu_dynamic_add_label(pmVar11,"Accept",'a',4,pcVar9);
    menu_dynamic_add_label(pmVar11,"Quit",'q',5,pcVar9);
    menu_dynamic_add_label(pmVar11,"Help",'?',6,pcVar9);
    screen_save();
    menu_dynamic_calc_location(pmVar11,uVar12 & 0xff,uVar12 >> 8 & 0xff);
    region_erase_bordered((region *)&pmVar11->boundary);
    iVar23 = menu_dynamic_select(pmVar11);
    menu_dynamic_free(pmVar11);
    string_free(pcVar9);
    screen_load();
    bVar24 = BIRTH_ROLLER;
    switch(iVar23) {
    case 1:
      goto switchD_001c6d84_caseD_1;
    case 2:
switchD_001c6d84_caseD_2:
      cmdq_push(CMD_ROLL_STATS);
      roller_command_prev_roll = 1;
      break;
    case 3:
switchD_001c6d84_caseD_3:
      cmdq_push(CMD_PREV_STATS);
      break;
    case 4:
switchD_001c6d84_caseD_4:
      bVar24 = BIRTH_NAME_CHOICE;
      goto switchD_001c6d84_default;
    case 5:
switchD_001c6d84_caseD_5:
      quit((char *)0x0);
      break;
    case 6:
switchD_001c6d84_caseD_6:
      do_cmd_help();
      break;
    default:
      goto switchD_001c6d84_default;
    }
LAB_001c6f6d:
    bVar24 = BIRTH_ROLLER;
switchD_001c6d84_default:
    local_25c = BIRTH_ROLLER;
    goto LAB_001c6f75;
  case BIRTH_NAME_CHOICE:
    if (bVar22 < BIRTH_NAME_CHOICE) {
      display_player(L'\0');
    }
    if (arg_name[0] != '\0') {
      my_strcpy(player->full_name,arg_name,0x20);
    }
    if (arg_force_name == false) {
      _Var1 = get_character_name(old_history,0x20);
      if ((!_Var1) ||
         (((savefile[0] == '\0' &&
           (_Var1 = savefile_name_already_used(old_history,true,true), _Var1)) &&
          (_Var1 = get_check("A savefile for that name exists.  Overwrite it? "), !_Var1)))) {
        bVar26 = false;
        bVar24 = local_25c;
        break;
      }
      cmdq_push(CMD_NAME_CHOICE);
      pcVar10 = cmdq_peek();
      cmd_set_arg_string(pcVar10,"name",old_history);
    }
LAB_001c665c:
    bVar26 = false;
    bVar24 = BIRTH_HISTORY_CHOICE;
    break;
  case BIRTH_HISTORY_CHOICE:
    if (bVar22 < BIRTH_HISTORY_CHOICE) {
      display_player(L'\0');
    }
    my_strcpy(old_history,player->history,0xf0);
    prt("Accept character history? [y/n]",L'\0',L'\0');
    kVar28 = inkey();
    if (kVar28._0_8_ >> 0x20 == 0x18) {
      bVar24 = BIRTH_RESET;
      quit((char *)0x0);
      goto LAB_001c6bd0;
    }
    if (kVar28.code == 0xe000) {
      bVar26 = false;
      bVar24 = BIRTH_NAME_CHOICE;
    }
    else {
      bVar24 = BIRTH_FINAL_CONFIRM;
      if ((kVar28._0_8_ & 0xffffffdf00000000) != 0x4e00000000) goto LAB_001c6bd0;
      my_strcpy((char *)local_218,player->history,0xf0);
      local_250 = strlen((char *)local_218);
      iVar23 = 0;
      bVar26 = false;
      while (!bVar26) {
        tb = textblock_new();
        line_starts = (size_t *)0x0;
        line_lengths = (size_t *)0x0;
        clear_from(L'\x12');
        uVar16 = 0;
        textblock_append(tb,"%s",local_218);
        orig_area.width = L'G';
        orig_area.page_rows = L'\x05';
        orig_area.col = L'\x01';
        orig_area.row = L'\x13';
        textui_textblock_place(tb,orig_area,(char *)0x0);
        sVar7 = textblock_calculate_lines(tb,&line_starts,&line_lengths,0x47);
        iVar17 = 0;
        if (sVar7 != 0) {
          iVar17 = (int)line_lengths[sVar7 - 1] + (int)line_starts[sVar7 - 1];
        }
        n = (ulong)iVar23;
        if (line_lengths != (size_t *)0x0 && line_starts != (size_t *)0x0) {
          lVar21 = 0;
          for (uVar18 = 0; sVar7 != uVar18; uVar18 = uVar18 + 1) {
            if ((line_starts[uVar18] <= n) && (n <= line_starts[uVar18] + line_lengths[uVar18])) {
              wVar20 = (iVar23 - (int)lVar21) + L'\x01';
              uVar16 = uVar18 & 0xffffffff;
              goto LAB_001c681b;
            }
            lVar21 = lVar21 + line_lengths[uVar18] + 1;
          }
        }
        wVar20 = L'\x01';
LAB_001c681b:
        iVar5 = (int)uVar16;
        Term_gotoxy(wVar20,iVar5 + L'\x13');
        kVar28 = inkey();
        local_230 = kVar28._0_8_;
        local_228 = kVar28.mods;
        kVar2 = kVar28.code;
        iVar25 = (int)local_250;
        lVar21 = (long)iVar25;
        switch(kVar2) {
        case 0x94:
          iVar23 = 0;
          goto LAB_001c6a2a;
        case 0x95:
        case 0x97:
        case 0x98:
        case 0x99:
        case 0x9a:
        case 0x9b:
        case 0x9d:
switchD_001c6851_caseD_95:
          _Var1 = keycode_isprint(kVar2);
          if (_Var1) {
            sVar7 = utf32_to_utf8(local_235,5,(uint32_t *)((long)&local_230 + 4),1,(size_t *)0x0);
            iVar5 = (int)sVar7;
            if (iVar5 == 0) goto LAB_001c69cc;
            uVar12 = iVar25 + iVar5;
            if ((int)uVar12 < 0xf0) {
              if (iVar23 == iVar17) {
                pcVar9 = (char *)((long)local_218 + lVar21);
              }
              else {
                pcVar9 = utf8_fskip((char *)local_218,n,(char *)0x0);
                if (pcVar9 == (char *)0x0) {
                  __assert_fail("ocurs",
                                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-birth.c"
                                ,0x6c4,"int edit_text(char *, int)");
                }
                memmove(pcVar9 + iVar5,pcVar9,(size_t)((long)local_218 + (lVar21 - (long)pcVar9)));
              }
              memcpy(pcVar9,local_235,(long)iVar5);
              iVar23 = iVar23 + 1;
              local_250 = (ulong)uVar12;
              *(undefined1 *)((long)local_218 + (long)(int)uVar12) = 0;
            }
            else {
              local_250 = local_250 & 0xffffffff;
            }
          }
          else {
LAB_001c69cc:
            local_250 = local_250 & 0xffffffff;
          }
          bVar26 = false;
          break;
        case 0x96:
          bVar26 = false;
          iVar23 = iVar17;
          if (iVar17 < 1) {
            iVar23 = 0;
          }
          break;
        case 0x9c:
          bVar26 = true;
          break;
        case 0x9e:
        case 0x9f:
          if ((kVar2 != 0x9f) || (bVar26 = false, iVar23 != 0)) {
            if ((kVar2 != 0x9e) || (iVar23 < iVar17)) {
              pcVar9 = utf8_fskip((char *)local_218,n,(char *)0x0);
              if (pcVar9 == (char *)0x0) {
                __assert_fail("ocurs",
                              "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-birth.c"
                              ,0x691,"int edit_text(char *, int)");
              }
              if (local_230._4_4_ == 0x9f) {
                pcVar8 = utf8_rskip(pcVar9,1,(char *)local_218);
                if (pcVar8 == (char *)0x0) {
                  __assert_fail("oshift",
                                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-birth.c"
                                ,0x695,"int edit_text(char *, int)");
                }
                local_220 = pcVar9;
                memmove(pcVar8,pcVar9,(size_t)((long)local_218 + (lVar21 - (long)pcVar9)));
                iVar23 = iVar23 + -1;
                iVar17 = (int)local_220;
                pcVar9 = pcVar8;
              }
              else {
                pcVar8 = utf8_fskip(pcVar9,1,(char *)0x0);
                if (pcVar8 == (char *)0x0) {
                  __assert_fail("oshift",
                                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-birth.c"
                                ,0x69e,"int edit_text(char *, int)");
                }
                iVar17 = (int)pcVar8;
                memmove(pcVar9,pcVar8,(size_t)((long)local_218 + (lVar21 - (long)pcVar8)));
              }
              uVar12 = iVar25 + ((int)pcVar9 - iVar17);
              local_250 = (ulong)uVar12;
              *(undefined1 *)((long)local_218 + (long)(int)uVar12) = 0;
            }
            goto LAB_001c6a2a;
          }
          iVar23 = 0;
          break;
        default:
          switch(kVar2) {
          case 0x80:
            iVar5 = (int)line_lengths[iVar5] + iVar23 + 1;
            if (iVar5 < iVar17) {
              iVar23 = iVar5;
            }
            break;
          case 0x81:
            iVar23 = iVar23 - (uint)(0 < iVar23);
            break;
          case 0x82:
            iVar23 = iVar23 + (uint)(iVar23 < iVar17);
            break;
          case 0x83:
            if (iVar5 < 1) {
              bVar26 = false;
            }
            else {
              iVar17 = ~(uint)line_lengths[uVar16 - 1] + iVar23;
              if (iVar17 < 0) {
                iVar17 = iVar23;
              }
              bVar26 = false;
              iVar23 = iVar17;
            }
            goto LAB_001c6a30;
          default:
            if (kVar2 != 0xe000) goto switchD_001c6851_caseD_95;
            bVar24 = BIRTH_NAME_CHOICE;
            goto LAB_001c6c27;
          }
LAB_001c6a2a:
          bVar26 = false;
        }
LAB_001c6a30:
        mem_free(line_starts);
        mem_free(line_lengths);
        textblock_free(tb);
      }
      cmdq_push(CMD_HISTORY_CHOICE);
      pcVar10 = cmdq_peek();
      cmd_set_arg_string(pcVar10,"history",(char *)local_218);
      bVar24 = BIRTH_HISTORY_CHOICE;
LAB_001c6c27:
      bVar26 = false;
    }
    break;
  case BIRTH_FINAL_CONFIRM:
    if (bVar22 < BIRTH_FINAL_CONFIRM) {
      display_player(L'\0');
    }
    prt("[\'ESC\' to step back, \'S\' to start over, or any other key to continue]",
        Term->hgt + L'\xffffffff',Term->wid / 2 + L'\xffffffde');
    kVar28 = inkey();
    if ((kVar28._0_8_ & 0xffffffdf00000000) != 0x5300000000) {
      if (kVar28._0_8_ >> 0x20 != 0x18) {
        if (kVar28.code == 0xe000) {
          clear_from(L'\x17');
          goto LAB_001c665c;
        }
        cmdq_push(CMD_ACCEPT_CHARACTER);
        clear_from(L'\x17');
        bVar26 = true;
        bVar24 = BIRTH_COMPLETE;
        break;
      }
      quit((char *)0x0);
    }
    clear_from(L'\x17');
    bVar24 = BIRTH_RESET;
LAB_001c6bd0:
    bVar26 = false;
    break;
  default:
    bVar26 = false;
    bVar24 = current;
  }
  goto switchD_001c6f46_caseD_3;
code_r0x001c6463:
  if (uVar4 == EVT_ESCAPE) goto switchD_001c6ed4_caseD_3;
  goto LAB_001c6450;
switchD_001c6ed4_caseD_3:
  bVar24 = BIRTH_ROLLER_CHOICE;
switchD_001c6ed4_caseD_5:
  event_remove_handler(EVENT_BIRTHPOINTS,point_based_points,(void *)0x0);
  event_remove_handler(EVENT_STATS,point_based_stats,(void *)0x0);
  event_remove_handler(EVENT_GOLD,point_based_misc,(void *)0x0);
  local_25c = BIRTH_POINTBASED;
LAB_001c6f75:
  bVar26 = false;
switchD_001c6f46_caseD_3:
  cmdq_execute(CTX_BIRTH);
  bVar22 = current;
  goto LAB_001c5daf;
}

Assistant:

int textui_do_birth(void)
{
	enum birth_stage current_stage = BIRTH_RESET;
	enum birth_stage prev = BIRTH_BACK;
	enum birth_stage roller = BIRTH_RESET;
	enum birth_stage next = current_stage;

	bool done = false;

	cmdq_push(CMD_BIRTH_INIT);
	cmdq_execute(CTX_BIRTH);

	while (!done) {

		switch (current_stage)
		{
			case BIRTH_RESET:
			{
				cmdq_push(CMD_BIRTH_RESET);

				roller = BIRTH_RESET;
				
				if (quickstart_allowed)
					next = BIRTH_QUICKSTART;
				else
					next = BIRTH_MAP_CHOICE;

				break;
			}

			case BIRTH_QUICKSTART:
			{
				display_player(0);
				next = textui_birth_quickstart();
				if (next == BIRTH_COMPLETE)
					done = true;
				break;
			}

			case BIRTH_MAP_CHOICE:
			{
				print_map_instructions();
				next = get_map_command();
				if (next == BIRTH_BACK)
					next = BIRTH_RESET;
				break;
			}

			case BIRTH_CLASS_CHOICE:
			case BIRTH_RACE_CHOICE:
			case BIRTH_ROLLER_CHOICE:
			{
				struct menu *menu = &race_menu;
				cmd_code command = CMD_CHOOSE_RACE;

				Term_clear();
				print_menu_instructions();

				if (current_stage > BIRTH_RACE_CHOICE) {
					menu_refresh(&race_menu, false);
					menu = &class_menu;
					command = CMD_CHOOSE_CLASS;
				}

				if (current_stage > BIRTH_CLASS_CHOICE) {
					menu_refresh(&class_menu, false);
					menu = &roller_menu;
				}

				next = menu_question(current_stage, menu, command);

				if (next == BIRTH_BACK)
					next = current_stage - 1;

				/* Make sure the character gets reset before quickstarting */
				if (next == BIRTH_QUICKSTART) 
					next = BIRTH_RESET;

				break;
			}

			case BIRTH_POINTBASED:
			{
				roller = BIRTH_POINTBASED;
		
				if (prev > BIRTH_POINTBASED) {
					point_based_start();
					/*
					 * Force a redraw of the point
					 * allocations but do not reset them.
					 */
					cmdq_push(CMD_REFRESH_STATS);
					cmdq_execute(CTX_BIRTH);
				}

				next = point_based_command();

				if (next == BIRTH_BACK)
					next = BIRTH_ROLLER_CHOICE;

				if (next != BIRTH_POINTBASED)
					point_based_stop();

				break;
			}

			case BIRTH_ROLLER:
			{
				roller = BIRTH_ROLLER;
				next = roller_command(prev < BIRTH_ROLLER);
				if (next == BIRTH_BACK)
					next = BIRTH_ROLLER_CHOICE;

				break;
			}

			case BIRTH_NAME_CHOICE:
			{
				if (prev < BIRTH_NAME_CHOICE)
					display_player(0);

				next = get_name_command();
				if (next == BIRTH_BACK)
					next = roller;

				break;
			}

			case BIRTH_HISTORY_CHOICE:
			{
				if (prev < BIRTH_HISTORY_CHOICE)
					display_player(0);

				next = get_history_command();
				if (next == BIRTH_BACK)
					next = BIRTH_NAME_CHOICE;

				break;
			}

			case BIRTH_FINAL_CONFIRM:
			{
				if (prev < BIRTH_FINAL_CONFIRM)
					display_player(0);

				next = get_confirm_command();
				if (next == BIRTH_BACK)
					next = BIRTH_HISTORY_CHOICE;

				if (next == BIRTH_COMPLETE)
					done = true;

				break;
			}

			default:
			{
				/* Remove dodgy compiler warning, */
			}
		}

		prev = current_stage;
		current_stage = next;

		/* Execute whatever commands have been sent */
		cmdq_execute(CTX_BIRTH);
	}

	return 0;
}